

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O1

void __thiscall PA4Application::RenderObject::loadWavefront(RenderObject *this,string *objname)

{
  pointer pSVar1;
  undefined1 this_00 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__x;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *values;
  VAO *this_02;
  size_t sVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_00;
  Texture *this_03;
  long lVar3;
  size_t sVar4;
  RenderObject *pRVar5;
  shared_ptr<Texture> texture;
  shared_ptr<VAO> vao;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vextexPositions;
  Image<unsigned_char> colorMap;
  ObjLoader objLoader;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  RenderObject *local_1f8;
  VAO *local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  shared_ptr<Texture> local_1e0;
  shared_ptr<Program> local_1d0;
  shared_ptr<VAO> local_1c0;
  vector<PA4Application::RenderObjectPart,_std::allocator<PA4Application::RenderObjectPart>_>
  *local_1b0;
  vector<SimpleMaterial,_std::allocator<SimpleMaterial>_> *local_1a8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_1a0;
  undefined1 local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Image<unsigned_char> local_148;
  ObjLoader local_130;
  
  local_1f8 = this;
  ObjLoader::ObjLoader(&local_130,objname);
  local_1a8 = ObjLoader::materials(&local_130);
  __x = ObjLoader::vertexPositions(&local_130);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_1a0,__x);
  values = ObjLoader::vertexUVs(&local_130);
  this_02 = (VAO *)operator_new(0x48);
  VAO::VAO(this_02,2);
  local_1f0 = this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VAO*>(&local_1e8,this_02);
  VAO::setVBO<glm::vec<3,float,(glm::qualifier)0>>(local_1f0,0,&local_1a0);
  VAO::setVBO<glm::vec<2,float,(glm::qualifier)0>>(local_1f0,1,values);
  sVar2 = ObjLoader::nbIBOs(&local_130);
  pRVar5 = local_1f8;
  if (sVar2 != 0) {
    local_1b0 = &local_1f8->m_parts;
    lVar3 = 0x48;
    sVar4 = 0;
    do {
      values_00 = ObjLoader::ibo(&local_130,(uint)sVar4);
      if ((values_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (values_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        VAO::makeSlaveVAO((VAO *)local_188);
        this_01._M_pi = _Stack_180._M_pi;
        this_00 = local_188;
        _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_188 = (undefined1  [8])0x0;
        VAO::setIBO<unsigned_int>((VAO *)this_00,values_00);
        pSVar1 = (local_1a8->super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        ObjLoader::image(&local_148,&local_130,
                         (string *)((long)&(pSVar1->name)._M_dataplus._M_p + lVar3));
        this_03 = (Texture *)operator_new(0x10);
        Texture::Texture(this_03,0xde1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Texture*>
                  (&local_200,this_03);
        Texture::setData<unsigned_char>(this_03,&local_148,false);
        pRVar5 = local_1f8;
        local_1c0.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_00;
        local_1c0.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_01._M_pi;
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
          }
        }
        local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_1f8->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (local_1f8->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_1e0.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_200._M_pi;
        if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_200._M_pi)->_M_use_count = (local_200._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_200._M_pi)->_M_use_count = (local_200._M_pi)->_M_use_count + 1;
          }
        }
        local_1e0.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_03;
        RenderObjectPart::RenderObjectPart
                  ((RenderObjectPart *)local_188,&local_1c0,&local_1d0,
                   (vec3 *)((long)pSVar1 + lVar3 + -0x1c),&local_1e0);
        std::
        vector<PA4Application::RenderObjectPart,_std::allocator<PA4Application::RenderObjectPart>_>
        ::emplace_back<PA4Application::RenderObjectPart>(local_1b0,(RenderObjectPart *)local_188);
        if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
        }
        if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
        }
        if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
        }
        if (local_1e0.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1e0.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d0.super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (local_1c0.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1c0.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    );
        }
        if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
        }
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
      }
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (sVar2 != sVar4);
  }
  local_188._0_4_ = 0x2601;
  Sampler::setParameter<int>
            ((pRVar5->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>
             ._M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2801,(int *)local_188);
  local_188._0_4_ = 0x2600;
  Sampler::setParameter<int>
            ((pRVar5->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>
             ._M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2800,(int *)local_188);
  local_188._0_4_ = 0x2901;
  Sampler::setParameter<int>
            ((pRVar5->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>
             ._M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2802,(int *)local_188);
  local_188._0_4_ = 0x2901;
  Sampler::setParameter<int>
            ((pRVar5->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>
             ._M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2803,(int *)local_188);
  if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
  }
  if (local_1a0.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ObjLoader::~ObjLoader(&local_130);
  return;
}

Assistant:

void PA4Application::RenderObject::loadWavefront(const std::string & objname)
{
  ObjLoader objLoader(objname);
  const std::vector<SimpleMaterial> & materials = objLoader.materials();
  std::vector<glm::vec3> vextexPositions = objLoader.vertexPositions();
  const std::vector<glm::vec2> & vertexUVs = objLoader.vertexUVs();
  // set up the VBOs of the master VAO
  std::shared_ptr<VAO> vao(new VAO(2));
  vao->setVBO(0, vextexPositions);
  vao->setVBO(1, vertexUVs);
  size_t nbParts = objLoader.nbIBOs();
  for (size_t k = 0; k < nbParts; k++) {
    const std::vector<uint> & ibo = objLoader.ibo(k);
    if (ibo.size() == 0) {
      continue;
    }
    std::shared_ptr<VAO> vaoSlave;
    vaoSlave = vao->makeSlaveVAO();
    vaoSlave->setIBO(ibo);
    const SimpleMaterial & material = materials[k];
    Image<> colorMap = objLoader.image(material.diffuseTexName);
    std::shared_ptr<Texture> texture(new Texture(GL_TEXTURE_2D));
    texture->setData(colorMap);
    m_parts.push_back(RenderObjectPart(vaoSlave, m_program, material.diffuse, texture));
  }
  m_colormap->setParameter(GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  m_colormap->setParameter(GL_TEXTURE_MAG_FILTER, GL_NEAREST);
  m_colormap->setParameter(GL_TEXTURE_WRAP_S, GL_REPEAT);
  m_colormap->setParameter(GL_TEXTURE_WRAP_T, GL_REPEAT);
}